

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

A * hiberlite::Database::dbLoad<A>(bean_key *key)

{
  A *pAVar1;
  BeanLoader bl;
  bean_key local_130;
  BeanLoader local_118;
  
  BeanLoader::BeanLoader(&local_118);
  bean_key::bean_key(&local_130,key);
  pAVar1 = BeanLoader::loadBean<A>(&local_118,&local_130);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_130.con);
  BeanLoader::~BeanLoader(&local_118);
  return pAVar1;
}

Assistant:

C* Database::dbLoad(bean_key key)
{
	BeanLoader bl;
	return bl.loadBean<C>(key);
}